

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

void lj_ffh_coroutine_wrap_err(lua_State *L,lua_State *co)

{
  TValue *L_00;
  uint64_t *msg;
  long in_RSI;
  lua_State *in_RDI;
  
  *(long *)(in_RSI + 0x18) = *(long *)(in_RSI + 0x18) + -8;
  L_00 = in_RDI->top;
  msg = *(uint64_t **)(in_RSI + 0x18);
  L_00->u64 = *msg;
  in_RDI->top = in_RDI->top + 1;
  if (*(int *)((long)in_RDI->top + -4) == -5) {
    lj_err_callermsg((lua_State *)&L_00->field_2,(char *)msg);
  }
  lj_err_run(in_RDI);
}

Assistant:

void LJ_FASTCALL lj_ffh_coroutine_wrap_err(lua_State *L, lua_State *co)
{
  co->top--; copyTV(L, L->top, co->top); L->top++;
  if (tvisstr(L->top-1))
    lj_err_callermsg(L, strVdata(L->top-1));
  else
    lj_err_run(L);
}